

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O0

SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> * __thiscall
SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator<<=
          (SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> *this,int bits)

{
  int in_ESI;
  SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> *in_RDI;
  
  if (in_ESI < 0) {
    __assert_fail("!std::numeric_limits< U >::is_signed || bits >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/dcleblanc[P]SafeInt/Test/../SafeInt.hpp"
                  ,0x1781,
                  "SafeInt<T, E> &SafeInt<char>::operator<<=(U) [T = char, E = safeint_exception_handlers::SafeInt_InvalidParameter, U = int]"
                 );
  }
  if (in_ESI < 8) {
    in_RDI->m_int = (char)((int)in_RDI->m_int << ((byte)in_ESI & 0x1f));
    return in_RDI;
  }
  __assert_fail("bits < (int)safeint_internal::int_traits< T >::bitCount",
                "/workspace/llm4binary/github/license_c_cmakelists/dcleblanc[P]SafeInt/Test/../SafeInt.hpp"
                ,0x1782,
                "SafeInt<T, E> &SafeInt<char>::operator<<=(U) [T = char, E = safeint_exception_handlers::SafeInt_InvalidParameter, U = int]"
               );
}

Assistant:

SAFEINT_CONSTEXPR14 SafeInt< T, E >& operator <<=( U bits ) SAFEINT_NOTHROW
    {
        ShiftAssert( !std::numeric_limits< U >::is_signed || bits >= 0 );
        ShiftAssert( bits < (int)safeint_internal::int_traits< T >::bitCount );

        m_int <<= bits;
        return *this;
    }